

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O0

Output * __thiscall
ftxui::TerminalInputParser::ParseDCS(Output *__return_storage_ptr__,TerminalInputParser *this)

{
  bool bVar1;
  uchar uVar2;
  TerminalInputParser *this_local;
  
  while( true ) {
    do {
      bVar1 = Eat(this);
      if (!bVar1) {
        Output::Output(__return_storage_ptr__,UNCOMPLETED);
        return __return_storage_ptr__;
      }
      uVar2 = Current(this);
    } while (uVar2 != '\x1b');
    bVar1 = Eat(this);
    if (!bVar1) break;
    uVar2 = Current(this);
    if (uVar2 == '\\') {
      Output::Output(__return_storage_ptr__,SPECIAL);
      return __return_storage_ptr__;
    }
  }
  Output::Output(__return_storage_ptr__,UNCOMPLETED);
  return __return_storage_ptr__;
}

Assistant:

TerminalInputParser::Output TerminalInputParser::ParseDCS() {
  // Parse until the string terminator ST.
  while (1) {
    if (!Eat())
      return UNCOMPLETED;

    if (Current() != '\x1B')
      continue;

    if (!Eat())
      return UNCOMPLETED;

    if (Current() != '\\')
      continue;

    return SPECIAL;
  }
}